

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::~Vector
          (Vector<capnp::compiler::NodeTranslator::AuxNode> *this)

{
  AuxNode *pAVar1;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar2;
  AuxNode *pAVar3;
  ArrayDisposer *pAVar4;
  
  pAVar1 = (this->builder).ptr;
  if (pAVar1 != (AuxNode *)0x0) {
    pRVar2 = (this->builder).pos;
    pAVar3 = (this->builder).endPtr;
    (this->builder).ptr = (AuxNode *)0x0;
    (this->builder).pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
    (this->builder).endPtr = (AuxNode *)0x0;
    pAVar4 = (this->builder).disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pAVar1,0x40,(long)pRVar2 - (long)pAVar1 >> 6,(long)pAVar3 - (long)pAVar1 >> 6,
               ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::AuxNode,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }